

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_type_safe::object_ref<const_debugger_type,_false>_&,_const_type_safe::object_ref<const_debugger_type,_false>_&>
* __thiscall
Catch::ExprLhs<type_safe::object_ref<debugger_type_const,false>const&>::operator==
          (BinaryExpr<const_type_safe::object_ref<const_debugger_type,_false>_&,_const_type_safe::object_ref<const_debugger_type,_false>_&>
           *__return_storage_ptr__,
          ExprLhs<type_safe::object_ref<debugger_type_const,false>const&> *this,
          object_ref<const_debugger_type,_false> *rhs)

{
  object_ref<const_debugger_type,_false> *lhs;
  bool comparisonResult;
  StringRef local_30;
  object_ref<const_debugger_type,_false> *local_20;
  object_ref<const_debugger_type,_false> *rhs_local;
  ExprLhs<const_type_safe::object_ref<const_debugger_type,_false>_&> *this_local;
  
  local_20 = rhs;
  rhs_local = (object_ref<const_debugger_type,_false> *)this;
  this_local = (ExprLhs<const_type_safe::object_ref<const_debugger_type,_false>_&> *)
               __return_storage_ptr__;
  comparisonResult =
       compareEqual<type_safe::object_ref<debugger_type_const,false>,type_safe::object_ref<debugger_type_const,false>>
                 (*(object_ref<const_debugger_type,_false> **)this,rhs);
  lhs = *(object_ref<const_debugger_type,_false> **)this;
  StringRef::StringRef(&local_30,"==");
  BinaryExpr<const_type_safe::object_ref<const_debugger_type,_false>_&,_const_type_safe::object_ref<const_debugger_type,_false>_&>
  ::BinaryExpr(__return_storage_ptr__,comparisonResult,lhs,local_30,local_20);
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }